

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_MXF.cpp
# Opt level: O1

void ASDCP::WriterInfoDump(WriterInfo *Info,FILE *stream)

{
  undefined8 uVar1;
  char *pcVar2;
  char *pcVar3;
  char str_buf [40];
  undefined **ppuVar4;
  undefined1 uVar5;
  undefined8 local_6f;
  undefined8 uStack_67;
  char local_58 [40];
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  uVar5 = 1;
  local_6f = *(undefined8 *)Info->ProductUUID;
  uStack_67 = *(undefined8 *)(Info->ProductUUID + 8);
  ppuVar4 = &PTR__IArchive_00223d80;
  uVar1 = Kumu::bin2UUIDhex((uchar *)&local_6f,0x10,local_58,0x28);
  fprintf((FILE *)stream,"       ProductUUID: %s\n",uVar1);
  pcVar3 = "No";
  pcVar2 = "No";
  if (Info->EncryptedEssence != false) {
    pcVar2 = "Yes";
  }
  fprintf((FILE *)stream,
          "    ProductVersion: %s\n       CompanyName: %s\n       ProductName: %s\n  EncryptedEssence: %s\n"
          ,(Info->ProductVersion)._M_dataplus._M_p,(Info->CompanyName)._M_dataplus._M_p,
          (Info->ProductName)._M_dataplus._M_p,pcVar2,ppuVar4,uVar5);
  if (Info->EncryptedEssence == true) {
    if (Info->UsesHMAC != false) {
      pcVar3 = "Yes";
    }
    fprintf((FILE *)stream,"              HMAC: %s\n",pcVar3);
    local_6f = *(undefined8 *)Info->ContextID;
    uStack_67 = *(undefined8 *)(Info->ContextID + 8);
    uVar1 = Kumu::bin2UUIDhex((uchar *)&local_6f,0x10,local_58,0x28);
    fprintf((FILE *)stream,"         ContextID: %s\n",uVar1);
    local_6f = *(undefined8 *)Info->CryptographicKeyID;
    uStack_67 = *(undefined8 *)(Info->CryptographicKeyID + 8);
    uVar1 = Kumu::bin2UUIDhex((uchar *)&local_6f,0x10,local_58,0x28);
    fprintf((FILE *)stream,"CryptographicKeyID: %s\n",uVar1);
  }
  local_6f = *(undefined8 *)Info->AssetUUID;
  uStack_67 = *(undefined8 *)(Info->AssetUUID + 8);
  uVar1 = Kumu::bin2UUIDhex((uchar *)&local_6f,0x10,local_58,0x28);
  fprintf((FILE *)stream,"         AssetUUID: %s\n",uVar1);
  pcVar2 = "Unknown";
  if (Info->LabelSetType == LS_MXF_INTEROP) {
    pcVar2 = "MXF Interop";
  }
  pcVar3 = "SMPTE";
  if (Info->LabelSetType != LS_MXF_SMPTE) {
    pcVar3 = pcVar2;
  }
  fprintf((FILE *)stream,"    Label Set Type: %s\n",pcVar3);
  return;
}

Assistant:

void
ASDCP::WriterInfoDump(const WriterInfo& Info, FILE* stream)
{
  if ( stream == 0 )
    stream = stderr;

  char str_buf[40];

  fprintf(stream,"       ProductUUID: %s\n", UUID(Info.ProductUUID).EncodeHex(str_buf, 40));
  fprintf(stream,"\
    ProductVersion: %s\n\
       CompanyName: %s\n\
       ProductName: %s\n\
  EncryptedEssence: %s\n",
	  Info.ProductVersion.c_str(),
	  Info.CompanyName.c_str(),
	  Info.ProductName.c_str(),
	  ( Info.EncryptedEssence ? "Yes" : "No" )
	  );

  if ( Info.EncryptedEssence )
    {
      fprintf(stream, "              HMAC: %s\n", ( Info.UsesHMAC ? "Yes" : "No"));
      fprintf(stream, "         ContextID: %s\n", UUID(Info.ContextID).EncodeHex(str_buf, 40));
      fprintf(stream, "CryptographicKeyID: %s\n", UUID(Info.CryptographicKeyID).EncodeHex(str_buf, 40));
    }

  fprintf(stream,"         AssetUUID: %s\n", UUID(Info.AssetUUID).EncodeHex(str_buf, 40));
  fprintf(stream,"    Label Set Type: %s\n", ( Info.LabelSetType == LS_MXF_SMPTE ? "SMPTE" :
					       ( Info.LabelSetType == LS_MXF_INTEROP ? "MXF Interop" :
						 "Unknown" ) ));
}